

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O1

int main(int argc,char **argv)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLint GVar7;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar8;
  GLFWwindow *handle_00;
  undefined1 *puVar9;
  int i;
  uint uVar10;
  long lVar11;
  int j;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  int height;
  bool bVar16;
  float fVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  GLuint vertex_buffer;
  mat4x4 p;
  mat4x4 mvp;
  mat4x4 temp;
  mat4x4 m;
  double local_148;
  GLuint local_13c;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [48];
  float local_48;
  undefined8 local_44;
  
  bVar16 = true;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"fh");
      if (iVar3 != 0x66) break;
      bVar16 = false;
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x68) {
      usage();
LAB_0011106f:
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
LAB_00110c64:
    exit(1);
  }
  if (bVar16) {
    iVar3 = 0x280;
    height = 0x1e0;
    handle = (GLFWmonitor *)0x0;
  }
  else {
    handle = glfwGetPrimaryMonitor();
    pGVar8 = glfwGetVideoMode(handle);
    glfwWindowHint(0x21001,pGVar8->redBits);
    glfwWindowHint(0x21002,pGVar8->greenBits);
    glfwWindowHint(0x21003,pGVar8->blueBits);
    glfwWindowHint(0x2100f,pGVar8->refreshRate);
    iVar3 = pGVar8->width;
    height = pGVar8->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  handle_00 = glfwCreateWindow(iVar3,height,"",handle,(GLFWwindow *)0x0);
  if (handle_00 == (GLFWwindow *)0x0) {
    glfwTerminate();
    goto LAB_00110c64;
  }
  glfwMakeContextCurrent(handle_00);
  gladLoadGLLoader(glfwGetProcAddress);
  swap_interval = 0;
  glfwSwapInterval(0);
  update_window_title(handle_00);
  local_148 = glfwGetTime();
  frame_rate = 0.0;
  iVar3 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
  uVar10 = 1;
  if (iVar3 == 0) {
    iVar3 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
    uVar10 = (uint)(iVar3 != 0);
  }
  swap_tear = uVar10;
  glfwSetFramebufferSizeCallback(handle_00,framebuffer_size_callback);
  glfwSetKeyCallback(handle_00,key_callback);
  (*glad_glGenBuffers)(1,&local_13c);
  (*glad_glBindBuffer)(0x8892,local_13c);
  (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
  GVar4 = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(GVar4,1,&vertex_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(GVar4);
  GVar5 = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(GVar5,1,&fragment_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(GVar5);
  GVar6 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar6,GVar4);
  (*glad_glAttachShader)(GVar6,GVar5);
  (*glad_glLinkProgram)(GVar6);
  GVar7 = (*glad_glGetUniformLocation)(GVar6,"MVP");
  GVar4 = (*glad_glGetAttribLocation)(GVar6,"vPos");
  (*glad_glEnableVertexAttribArray)(GVar4);
  (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',8,(void *)0x0);
  iVar3 = glfwWindowShouldClose(handle_00);
  if (iVar3 == 0) {
    lVar14 = 0;
    do {
      dVar2 = glfwGetTime();
      fVar17 = cosf((float)dVar2 * 4.0);
      (*glad_glClear)(0x4000);
      local_138 = 0x3f800000;
      local_130 = 0;
      local_128 = 0x3f80000000000000;
      uStack_120 = 0;
      local_110 = 0xc0000000;
      local_118 = 0;
      local_108 = 0x8000000080000000;
      uStack_100 = 0x3f800000bf800000;
      lVar11 = 0;
      puVar9 = local_78;
      do {
        lVar12 = 0;
        do {
          uVar18 = 0x3f800000;
          if (lVar11 != lVar12) {
            uVar18 = 0;
          }
          *(undefined4 *)(puVar9 + lVar12 * 4) = uVar18;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + 0x10;
      } while (lVar11 != 4);
      local_48 = fVar17 * 0.75;
      local_44 = 0;
      lVar11 = 0;
      puVar9 = local_78;
      do {
        lVar12 = 0;
        puVar13 = &local_138;
        do {
          pfVar1 = (float *)((long)&local_b8 + lVar12 * 4 + lVar11 * 0x10);
          *pfVar1 = 0.0;
          fVar17 = 0.0;
          lVar15 = 0;
          do {
            fVar17 = fVar17 + *(float *)((long)puVar13 + lVar15 * 4) * *(float *)(puVar9 + lVar15);
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x10);
          *pfVar1 = fVar17;
          lVar12 = lVar12 + 1;
          puVar13 = (undefined8 *)((long)puVar13 + 4);
        } while (lVar12 != 4);
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + 0x10;
      } while (lVar11 != 4);
      local_c8 = local_88;
      uStack_c0 = uStack_80;
      local_d8 = local_98;
      uStack_d0 = uStack_90;
      local_e8 = local_a8;
      uStack_e0 = uStack_a0;
      local_f8 = local_b8;
      uStack_f0 = uStack_b0;
      (*glad_glUseProgram)(GVar6);
      (*glad_glUniformMatrix4fv)(GVar7,1,'\0',(GLfloat *)&local_f8);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(handle_00);
      glfwPollEvents();
      lVar14 = lVar14 + 1;
      dVar2 = glfwGetTime();
      if (1.0 < dVar2 - local_148) {
        auVar19._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar19._0_8_ = lVar14;
        auVar19._12_4_ = 0x45300000;
        frame_rate = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                     (dVar2 - local_148);
        update_window_title(handle_00);
        lVar14 = 0;
        local_148 = dVar2;
      }
      iVar3 = glfwWindowShouldClose(handle_00);
    } while (iVar3 == 0);
  }
  glfwTerminate();
  goto LAB_0011106f;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    unsigned long frame_count = 0;
    double last_time, current_time;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(width, height, "", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetKeyCallback(window, key_callback);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        mat4x4 m, p, mvp;
        float position = cosf((float) glfwGetTime() * 4.f) * 0.75f;

        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_ortho(p, -1.f, 1.f, -1.f, 1.f, 0.f, 1.f);
        mat4x4_translate(m, position, 0.f, 0.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}